

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::TPZParFrontMatrix(TPZParFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                    *this,int64_t globalsize)

{
  TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  *unaff_retaddr;
  TPZStack<TPZEqnArray<std::complex<long_double>_>_*,_10> *in_stack_ffffffffffffffd0;
  int64_t newsize;
  TPZRegisterClassId *vtt;
  
  newsize = 0;
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZParFrontMatrix<std::complex<long_double>,TPZFileEqnStorage<std::complex<long_double>>,TPZFrontSym<std::complex<long_double>>>>
            (in_RDI,0x21);
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  ::TPZFrontMatrix(unaff_retaddr,(void **)vtt,(int64_t)in_RSI);
  *(undefined ***)in_RDI = &PTR__TPZParFrontMatrix_02555a80;
  TPZStack<TPZEqnArray<std::complex<long_double>_>_*,_10>::TPZStack(in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 0x2c0) = 0;
  *(undefined8 *)(in_RDI + 0x2d8) = 0;
  *(undefined8 *)(in_RDI + 0x2e0) = 0;
  *(undefined8 *)(in_RDI + 0x2c8) = 0;
  *(undefined8 *)(in_RDI + 0x2d0) = 0;
  *(undefined8 *)(in_RDI + 0x2e8) = 0;
  std::mutex::mutex((mutex *)0x1d4cdf3);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x2f0));
  TPZManVector<TPZEqnArray<std::complex<long_double>_>_*,_10>::Resize(in_RSI,newsize);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix(int64_t globalsize) :
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), TPZFrontMatrix<TVar, store, front>(globalsize),
fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}